

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomItem::write(DomItem *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomProperty **ppDVar2;
  DomProperty *this_00;
  DomItem **ppDVar3;
  DomItem *this_01;
  char16_t *pcVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  long lVar7;
  long in_FS_OFFSET;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar6._4_4_ = in_register_00000034;
  aVar6._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_50.d = (Data *)0x0;
    local_50.ptr = L"item";
    local_68.size = 0;
    local_50.size = 4;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar8.m_size = (size_t)local_50.ptr;
  QVar8.field_0.m_data = aVar6.m_data;
  QXmlStreamWriter::writeStartElement(QVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_row == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"row",3);
    pcVar4 = local_50.ptr;
    aVar5.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_row);
    QVar9.m_size = (size_t)pcVar4;
    QVar9.field_0.m_data = aVar6.m_data;
    QVar11.m_size = (size_t)local_80.ptr;
    QVar11.field_0.m_data = aVar5.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar9,QVar11);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_column == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"column",6);
    pcVar4 = local_50.ptr;
    aVar5.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_column);
    QVar10.m_size = (size_t)pcVar4;
    QVar10.field_0.m_data = aVar6.m_data;
    QVar12.m_size = (size_t)local_80.ptr;
    QVar12.field_0.m_data = aVar5.m_data;
    QXmlStreamWriter::writeAttribute(QVar10,QVar12);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    __n = (size_t)local_80.ptr;
  }
  ppDVar2 = (this->m_property).d.ptr;
  lVar1 = (this->m_property).d.size;
  for (lVar7 = 0; lVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
    this_00 = *(DomProperty **)((long)ppDVar2 + lVar7);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"property",8);
    DomProperty::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar3 = (this->m_item).d.ptr;
  lVar1 = (this->m_item).d.size;
  for (lVar7 = 0; lVar1 << 3 != lVar7; lVar7 = lVar7 + 8) {
    this_01 = *(DomItem **)((long)ppDVar3 + lVar7);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"item",4);
    write(this_01,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomItem::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("item") : tagName.toLower());

    if (hasAttributeRow())
        writer.writeAttribute(u"row"_s, QString::number(attributeRow()));

    if (hasAttributeColumn())
        writer.writeAttribute(u"column"_s, QString::number(attributeColumn()));

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomItem *v : m_item)
        v->write(writer, u"item"_s);

    writer.writeEndElement();
}